

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O2

Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> * __thiscall
KDIS::UTILS::Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*
          (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *__return_storage_ptr__,
          Matrix<float,(unsigned_char)3,(unsigned_char)3> *this,double Value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *pMVar4;
  KUINT16 i;
  long lVar5;
  long lVar6;
  
  pMVar4 = __return_storage_ptr__;
  __return_storage_ptr__->Data[2][2] = *(float *)(this + 0x20);
  uVar1 = *(undefined8 *)this;
  uVar2 = *(undefined8 *)(this + 8);
  uVar3 = *(undefined8 *)(this + 0x18);
  *(undefined8 *)(__return_storage_ptr__->Data[1] + 1) = *(undefined8 *)(this + 0x10);
  *(undefined8 *)__return_storage_ptr__->Data[2] = uVar3;
  *(undefined8 *)__return_storage_ptr__->Data[0] = uVar1;
  *(undefined8 *)(__return_storage_ptr__->Data[0] + 2) = uVar2;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      (*(float (*) [3])*(float (*) [3])__return_storage_ptr__)[lVar6] =
           (float)((double)(*(float (*) [3])*(float (*) [3])__return_storage_ptr__)[lVar6] * Value);
    }
    __return_storage_ptr__ =
         (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)
         ((long)__return_storage_ptr__ + 0xc);
  }
  return pMVar4;
}

Assistant:

Matrix operator * ( const T Value )
    {
        Matrix m = *this;
        for( KUINT16 i = 0; i < cols; ++i )
        {
            for( KUINT16 j = 0; j < rows; ++j )
            {
                m.Data[i][j] *= Value;
            }
        }

        return m;
    }